

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O2

uint64_t __thiscall slang::SourceManager::getSortKey(SourceManager *this,BufferID buffer)

{
  FileInfo *pFVar1;
  uint64_t uVar2;
  shared_lock<std::shared_mutex> lock;
  shared_lock<std::shared_mutex> local_28;
  
  local_28._M_owns = true;
  local_28._M_pm = &this->mutex;
  std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)this);
  pFVar1 = getFileInfo<std::shared_lock<std::shared_mutex>_>(this,buffer,&local_28);
  if (pFVar1 == (FileInfo *)0x0) {
    uVar2 = (ulong)buffer.id << 0x20;
  }
  else {
    uVar2 = pFVar1->sortKey;
  }
  std::shared_lock<std::shared_mutex>::~shared_lock(&local_28);
  return uVar2;
}

Assistant:

uint64_t SourceManager::getSortKey(BufferID buffer) const {
    std::shared_lock<std::shared_mutex> lock(mutex);
    auto info = getFileInfo(buffer, lock);
    if (!info)
        return uint64_t(buffer.getId()) << 32;

    return info->sortKey;
}